

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConnection.cxx
# Opt level: O0

void __thiscall cmEventBasedConnection::ReadData(cmEventBasedConnection *this,string *data)

{
  bool bVar1;
  byte bVar2;
  pointer pcVar3;
  string local_68 [48];
  string local_38 [8];
  string packet;
  string *data_local;
  cmEventBasedConnection *this_local;
  
  packet.field_2._8_8_ = data;
  std::__cxx11::string::operator+=((string *)&this->RawReadBuffer,(string *)data);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->BufferStrategy);
  if (bVar1) {
    pcVar3 = std::
             unique_ptr<cmConnectionBufferStrategy,_std::default_delete<cmConnectionBufferStrategy>_>
             ::operator->(&this->BufferStrategy);
    (*pcVar3->_vptr_cmConnectionBufferStrategy[2])(local_38,pcVar3,&this->RawReadBuffer);
    do {
      (*(this->super_cmConnection)._vptr_cmConnection[6])(this,local_38);
      pcVar3 = std::
               unique_ptr<cmConnectionBufferStrategy,_std::default_delete<cmConnectionBufferStrategy>_>
               ::operator->(&this->BufferStrategy);
      (*pcVar3->_vptr_cmConnectionBufferStrategy[2])(local_68,pcVar3,&this->RawReadBuffer);
      std::__cxx11::string::operator=(local_38,local_68);
      std::__cxx11::string::~string(local_68);
      bVar2 = std::__cxx11::string::empty();
    } while (((bVar2 ^ 0xff) & 1) != 0);
    std::__cxx11::string::~string(local_38);
  }
  else {
    (*(this->super_cmConnection)._vptr_cmConnection[6])(this,&this->RawReadBuffer);
    std::__cxx11::string::clear();
  }
  return;
}

Assistant:

void cmEventBasedConnection::ReadData(const std::string& data)
{
  this->RawReadBuffer += data;
  if (BufferStrategy) {
    std::string packet = BufferStrategy->BufferMessage(this->RawReadBuffer);
    do {
      ProcessRequest(packet);
      packet = BufferStrategy->BufferMessage(this->RawReadBuffer);
    } while (!packet.empty());

  } else {
    ProcessRequest(this->RawReadBuffer);
    this->RawReadBuffer.clear();
  }
}